

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-digits.c
# Opt level: O3

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  size_t sVar3;
  FILE *pFVar4;
  undefined4 in_register_0000003c;
  char *pcVar5;
  long lVar6;
  float fVar7;
  double dVar8;
  Settings local_48;
  char *local_38;
  
  pFVar4 = _stdout;
  name = *argv;
  local_48.delay = 0.0;
  local_48.output = (FILE *)_stdout;
  iVar2 = __posix_getopt(CONCAT44(in_register_0000003c,argc),argv,"d:o:");
  fVar7 = local_48.delay;
  pFVar1 = (FILE *)local_48.output;
  if (iVar2 != -1) {
    fVar7 = 0.0;
    do {
      local_38 = (char *)0x0;
      if (iVar2 == 0x6f) {
        if (pFVar4 != _stdout) {
          fclose(pFVar4);
        }
        pFVar4 = fopen(_optarg,"w");
      }
      else {
        if (iVar2 != 100) {
          fprintf(_stdout,"USAGE: %s [-d DELAY] [-o OUTPUTFILE] [FILE]...\n",name);
          goto LAB_001014ae;
        }
        dVar8 = strtod(_optarg,&local_38);
        pcVar5 = _optarg;
        sVar3 = strlen(_optarg);
        if (pcVar5 + sVar3 != local_38) {
          fprintf(_stderr,"%s ERROR:\t",name);
          pcVar5 = "d value is not a valid double";
          sVar3 = 0x1d;
          goto LAB_00101497;
        }
        fVar7 = (float)dVar8;
      }
      iVar2 = __posix_getopt(argc,argv,"d:o:");
      pFVar1 = pFVar4;
    } while (iVar2 != -1);
  }
  local_48.output = (FILE *)pFVar1;
  local_48.delay = fVar7;
  iVar2 = _optind;
  if (pFVar4 != (FILE *)0x0) {
    if (argc == _optind) {
      handle_file(_stdin,&local_48);
    }
    if (iVar2 < argc) {
      lVar6 = 0;
      do {
        pFVar4 = fopen(argv[iVar2 + lVar6],"r");
        if (pFVar4 == (FILE *)0x0) {
          fprintf(_stderr,"%s ERROR:\t",name);
          fprintf(_stderr,"couldn\'t open file %s",argv[iVar2 + lVar6]);
          fputc(10,_stderr);
        }
        else {
          handle_file((FILE *)pFVar4,&local_48);
          fclose(pFVar4);
        }
        lVar6 = lVar6 + 1;
      } while (argc - iVar2 != (int)lVar6);
    }
    exit(0);
  }
  fprintf(_stderr,"%s ERROR:\t",name);
  pcVar5 = "couldn\'t open output file";
  sVar3 = 0x19;
LAB_00101497:
  fwrite(pcVar5,sVar3,1,_stderr);
  fputc(10,_stderr);
LAB_001014ae:
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    name = argv[0];

    Settings set = {0, stdout};
    int i = handle_arguments(argc, argv, &set);

    if (i == argc)
    {
        handle_file(stdin, &set);
    }
    for (; i < argc; i++)
    {
        FILE *input = fopen(argv[i], "r");
        if (input == NULL)
        {
            ERROR_MSG("couldn't open file %s", argv[i]);
            continue;
        }
        handle_file(input, &set);
        fclose(input);
    }

    exit(EXIT_SUCCESS);
}